

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O3

hugeint_t duckdb::Hugeint::DivMod(hugeint_t lhs,hugeint_t rhs,hugeint_t *remainder)

{
  uint64_t uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  duckdb *pdVar4;
  int iVar5;
  duckdb *pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int64_t value;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  hugeint_t hVar15;
  hugeint_t hVar16;
  hugeint_t hVar17;
  hugeint_t result;
  hugeint_t local_80;
  hugeint_t local_70;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  hugeint_t local_40;
  
  uVar12 = rhs.upper;
  pdVar6 = (duckdb *)rhs.lower;
  uVar9 = lhs.upper;
  uVar11 = lhs.lower;
  hugeint_t::hugeint_t(&local_80,0);
  if (((duckdb *)local_80.lower == pdVar6) && (local_80.upper == uVar12)) {
    remainder->lower = uVar11;
    remainder->upper = uVar9;
    hugeint_t::hugeint_t(&local_40,0);
    uVar12 = local_40.upper;
    goto LAB_012ebd05;
  }
  if (uVar9 == 0x8000000000000000 && uVar11 == 0) {
    if (uVar12 == 0x8000000000000000 && pdVar6 == (duckdb *)0x0) {
      hugeint_t::hugeint_t(&local_70,0);
      remainder->lower = local_70.lower;
      remainder->upper = local_70.upper;
      value = 1;
      goto LAB_012ebcf6;
    }
    hugeint_t::hugeint_t(&local_70,1);
    hVar16.upper = local_70.upper | 0x8000000000000000;
    hVar16.lower = local_70.lower;
    local_80 = DivMod(hVar16,rhs,remainder);
    hVar16 = duckdb::Abs(*remainder);
    hugeint_t::hugeint_t(&local_70,1);
    auVar3._8_8_ = local_70.upper;
    auVar3._0_8_ = local_70.lower;
    hVar17 = duckdb::Abs(rhs);
    if (hVar17 == (hugeint_t)((undefined1  [16])hVar16 + auVar3)) {
      hVar17.lower = uVar12;
      iVar5 = Sign(pdVar6,hVar17);
      hugeint_t::hugeint_t(&local_70,(long)iVar5);
      local_80.upper = (local_80.upper - local_70.upper) - (ulong)(local_80.lower < local_70.lower);
      local_80.lower = local_80.lower - local_70.lower;
      hugeint_t::hugeint_t(&local_70,0);
      remainder->lower = local_70.lower;
      remainder->upper = local_70.upper;
    }
    else {
      hugeint_t::hugeint_t(&local_70,1);
      uVar12 = remainder->lower;
      remainder->lower = remainder->lower - local_70.lower;
      remainder->upper = (remainder->upper - local_70.upper) - (ulong)(uVar12 < local_70.lower);
    }
  }
  else {
    if (uVar12 != 0x8000000000000000 || pdVar6 != (duckdb *)0x0) {
      local_48 = ~uVar9 + (ulong)(uVar11 == 0);
      local_50 = -uVar11;
      if (-1 < (long)uVar9) {
        local_48 = uVar9;
        local_50 = uVar11;
      }
      uVar11 = ~uVar12 + (ulong)(pdVar6 == (duckdb *)0x0);
      pdVar4 = (duckdb *)-(long)pdVar6;
      if (-1 < (long)uVar12) {
        uVar11 = uVar12;
        pdVar4 = pdVar6;
      }
      remainder->lower = 0;
      remainder->upper = 0;
      iVar5 = 0x80;
      uVar13 = local_48;
      local_60 = uVar9;
      local_58 = uVar12;
      if ((local_48 == 0) && (iVar5 = 0x40, uVar13 = local_50, local_50 == 0)) {
        uVar12 = 0;
        uVar13 = 0;
      }
      else {
        lVar2 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar9 = (ulong)(iVar5 - ((uint)lVar2 ^ 0x3f) & 0xff);
        uVar12 = 0;
        uVar13 = 0;
        do {
          uVar7 = remainder->upper << 1 | remainder->lower >> 0x3f;
          pdVar6 = (duckdb *)(remainder->lower * 2);
          remainder->lower = (uint64_t)pdVar6;
          remainder->upper = uVar7;
          iVar5 = (int)uVar9;
          bVar14 = uVar9 < 0x41;
          uVar9 = uVar9 - 1;
          uVar10 = local_48;
          if (bVar14) {
            uVar10 = local_50;
          }
          uVar8 = (ulong)(iVar5 - 1U & 0xff);
          if (bVar14) {
            uVar8 = uVar9 & 0xffffffff;
          }
          if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
            hugeint_t::hugeint_t(&local_80,1);
            pdVar6 = (duckdb *)(local_80.lower + remainder->lower);
            uVar7 = local_80.upper + remainder->upper +
                    (ulong)CARRY8(local_80.lower,remainder->lower);
            remainder->lower = (uint64_t)pdVar6;
            remainder->upper = uVar7;
          }
          uVar12 = uVar12 << 1 | uVar13 >> 0x3f;
          uVar13 = uVar13 * 2;
          if (((long)uVar11 < (long)uVar7) || (pdVar4 <= pdVar6 && uVar7 == uVar11)) {
            remainder->lower = (long)pdVar6 - (long)pdVar4;
            remainder->upper = (uVar7 - uVar11) - (ulong)(pdVar6 < pdVar4);
            hugeint_t::hugeint_t(&local_80,1);
            bVar14 = CARRY8(uVar13,local_80.lower);
            uVar13 = uVar13 + local_80.lower;
            uVar12 = uVar12 + local_80.upper + (ulong)bVar14;
          }
        } while (uVar9 != 0);
      }
      local_40.lower = uVar13;
      if ((long)(local_58 ^ local_60) < 0) {
        local_40.lower = -uVar13;
        uVar12 = ~uVar12 + (ulong)(uVar13 == 0);
      }
      if ((long)local_60 < 0) {
        uVar1 = remainder->lower;
        remainder->lower = -uVar1;
        remainder->upper = ~remainder->upper + (ulong)(uVar1 == 0);
      }
      goto LAB_012ebd05;
    }
    remainder->lower = uVar11;
    remainder->upper = uVar9;
    value = 0;
LAB_012ebcf6:
    hugeint_t::hugeint_t(&local_80,value);
  }
  uVar12 = local_80.upper;
  local_40.lower = local_80.lower;
LAB_012ebd05:
  hVar15.upper = uVar12;
  hVar15.lower = local_40.lower;
  return hVar15;
}

Assistant:

hugeint_t Hugeint::DivMod(hugeint_t lhs, hugeint_t rhs, hugeint_t &remainder) {
	if (rhs == 0) {
		remainder = lhs;
		return hugeint_t(0);
	}

	// Check if one of the sides is hugeint_t minimum, as that can't be negated.
	if (lhs == NumericLimits<hugeint_t>::Minimum() || rhs == NumericLimits<hugeint_t>::Minimum()) {
		return DivModMinimum(lhs, rhs, remainder);
	}

	bool lhs_negative = lhs.upper < 0;
	bool rhs_negative = rhs.upper < 0;
	if (lhs_negative) {
		Hugeint::NegateInPlace<false>(lhs);
	}
	if (rhs_negative) {
		Hugeint::NegateInPlace<false>(rhs);
	}
	// DivMod code adapted from:
	// https://github.com/calccrypto/uint128_t/blob/master/uint128_t.cpp

	// initialize the result and remainder to 0
	hugeint_t div_result;
	div_result.lower = 0;
	div_result.upper = 0;
	remainder.lower = 0;
	remainder.upper = 0;

	uint8_t highest_bit_set = PositiveHugeintHighestBit(lhs);
	// now iterate over the amount of bits that are set in the LHS
	for (uint8_t x = highest_bit_set; x > 0; x--) {
		// left-shift the current result and remainder by 1
		div_result = PositiveHugeintLeftShift(div_result, 1);
		remainder = PositiveHugeintLeftShift(remainder, 1);

		// we get the value of the bit at position X, where position 0 is the least-significant bit
		if (PositiveHugeintIsBitSet(lhs, x - 1)) {
			remainder += 1;
		}
		if (Hugeint::GreaterThanEquals(remainder, rhs)) {
			// the remainder has passed the division multiplier: add one to the divide result
			remainder -= rhs;
			div_result += 1;
		}
	}
	if (lhs_negative ^ rhs_negative) {
		Hugeint::NegateInPlace<false>(div_result);
	}
	if (lhs_negative) {
		Hugeint::NegateInPlace<false>(remainder);
	}
	return div_result;
}